

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

bool __thiscall
Clasp::ShortImplicationsGraph::add(ShortImplicationsGraph *this,ImpType t,bool learnt,Literal *lits)

{
  pointer pIVar1;
  bool bVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  size_t __size;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __size_00;
  pointer pIVar4;
  Literal p;
  undefined4 in_register_00000034;
  void *__ptr;
  Literal LVar5;
  ulong uVar6;
  Literal q;
  uint uVar7;
  Literal r;
  left_type local_40;
  left_type local_3c;
  ulong local_38;
  
  __ptr = (void *)CONCAT44(in_register_00000034,t);
  __size = CONCAT71(in_register_00000011,learnt);
  uVar3 = lits->rep_;
  uVar7 = lits[1].rep_;
  r.rep_ = 2;
  if (t == ternary_imp) {
    r.rep_ = lits[2].rep_ & 0xfffffffe;
  }
  p.rep_ = uVar3 & 0xfffffffe;
  q.rep_ = uVar7 & 0xfffffffe;
  if (this->shared_ == false) {
    LVar5.rep_ = r.rep_;
    if (learnt) {
      p.rep_ = uVar3 | 1;
      q.rep_ = uVar7 | 1;
      LVar5.rep_ = r.rep_ | 1;
    }
    pIVar4 = (this->graph_).ebo_.buf + (p.rep_ >> 1 ^ 1);
    local_40.rep_ = q.rep_;
    local_3c.rep_ = p.rep_;
    if (t == binary_imp) {
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_left((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)pIVar4
                ,&local_40);
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_left((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                ((this->graph_).ebo_.buf + ((ulong)(local_40.rep_ >> 1) ^ 1)),&local_3c);
    }
    else {
      uVar3 = (pIVar4->super_ImpListBase).super_type.
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              right_;
      __size_00 = __size;
      uVar6 = (ulong)LVar5.rep_ << 0x20;
      if ((ulong)uVar3 <
          (ulong)(pIVar4->super_ImpListBase).super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 left_ + 8) {
        local_38 = (ulong)LVar5.rep_ << 0x20;
        bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
        realloc((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)pIVar4
                ,__ptr,__size);
        uVar3 = (pIVar4->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                right_;
        __size_00 = extraout_RDX;
        uVar6 = local_38;
      }
      (pIVar4->super_ImpListBase).super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ =
           uVar3 - 8;
      *(ulong *)((pIVar4->super_ImpListBase).super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 buf_ + (uVar3 - 8)) = CONCAT44(LVar5.rep_,q.rep_);
      uVar7 = q.rep_ >> 1 ^ 1;
      pIVar1 = (this->graph_).ebo_.buf;
      pIVar4 = pIVar1 + uVar7;
      uVar3 = pIVar1[uVar7].super_ImpListBase.super_type.
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              right_;
      if ((ulong)uVar3 <
          (ulong)pIVar1[uVar7].super_ImpListBase.super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 left_ + 8) {
        bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
        realloc((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)pIVar4
                ,__ptr,__size_00);
        uVar3 = (pIVar4->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                right_;
        __size_00 = extraout_RDX_00;
      }
      (pIVar4->super_ImpListBase).super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ =
           uVar3 - 8;
      *(ulong *)((pIVar4->super_ImpListBase).super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 buf_ + (uVar3 - 8)) = uVar6 | p.rep_;
      uVar7 = r.rep_ >> 1 ^ 1;
      pIVar1 = (this->graph_).ebo_.buf;
      pIVar4 = pIVar1 + uVar7;
      uVar3 = pIVar1[uVar7].super_ImpListBase.super_type.
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              right_;
      if ((ulong)uVar3 <
          (ulong)pIVar1[uVar7].super_ImpListBase.super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 left_ + 8) {
        bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
        realloc((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)pIVar4
                ,__ptr,__size_00);
        uVar3 = (pIVar4->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                right_;
      }
      (pIVar4->super_ImpListBase).super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ =
           uVar3 - 8;
      *(ulong *)((pIVar4->super_ImpListBase).super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 buf_ + (uVar3 - 8)) = CONCAT44(q.rep_,p.rep_);
    }
LAB_0015efd5:
    this->bin_[(ulong)(t == ternary_imp) * 2 + (__size & 0xffffffff)] =
         this->bin_[(ulong)(t == ternary_imp) * 2 + (__size & 0xffffffff)] + 1;
    bVar2 = true;
  }
  else {
    if (learnt) {
      local_40.rep_ = q.rep_;
      local_3c.rep_ = p.rep_;
      bVar2 = ImplicationList::hasLearnt((this->graph_).ebo_.buf + ((ulong)(uVar3 >> 1) ^ 1),q,r);
      if (!bVar2) {
        ImplicationList::addLearnt((this->graph_).ebo_.buf + (uVar3 >> 1 ^ 1),q,r);
        ImplicationList::addLearnt((this->graph_).ebo_.buf + ((ulong)(uVar7 >> 1) ^ 1),p,r);
        if (t == ternary_imp) {
          ImplicationList::addLearnt((this->graph_).ebo_.buf + (r.rep_ >> 1 ^ 1),p,q);
        }
        goto LAB_0015efd5;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ShortImplicationsGraph::add(ImpType t, bool learnt, const Literal* lits) {
	uint32& stats= (t == ternary_imp ? tern_ : bin_)[learnt];
	Literal p = lits[0], q = lits[1], r = (t == ternary_imp ? lits[2] : lit_false());
	p.unflag(), q.unflag(), r.unflag();
	if (!shared_) {
		if (learnt) { p.flag(), q.flag(), r.flag(); }
		if (t == binary_imp) {
			getList(~p).push_left(q);
			getList(~q).push_left(p);
		}
		else {
			getList(~p).push_right(std::make_pair(q, r));
			getList(~q).push_right(std::make_pair(p, r));
			getList(~r).push_right(std::make_pair(p, q));
		}
		++stats;
		return true;
	}
#if CLASP_HAS_THREADS
	else if (learnt && !getList(~p).hasLearnt(q, r)) {
		getList(~p).addLearnt(q, r);
		getList(~q).addLearnt(p, r);
		if (t == ternary_imp) {
			getList(~r).addLearnt(p, q);
		}
		++stats;
		return true;
	}
#endif
	return false;
}